

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

void __thiscall ED::ComputeAnchorPoints(ED *this)

{
  long lVar1;
  short *psVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  Point_<int> local_40;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_38;
  
  if (4 < this->height) {
    local_38 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&this->anchorPoints;
    iVar9 = 3;
    iVar8 = 1;
    iVar7 = 2;
    do {
      iVar6 = this->scanInterval;
      bVar11 = iVar7 % iVar6 == 0;
      iVar3 = iVar6;
      if (bVar11) {
        iVar3 = 1;
      }
      if (bVar11) {
        iVar6 = 2;
      }
      iVar5 = this->width;
      if (iVar6 < iVar5 + -2) {
        lVar10 = (long)iVar6;
        do {
          psVar2 = this->gradImg;
          lVar4 = (long)(iVar7 * iVar5);
          lVar1 = lVar10 + lVar4;
          iVar6 = (int)psVar2[lVar1];
          if (this->gradThresh <= iVar6) {
            local_40.x = (int)lVar10;
            if (this->dirImg[lVar10 + lVar4] == '\x01') {
              if ((this->anchorThresh <= iVar6 - psVar2[lVar1 + -1]) &&
                 (this->anchorThresh <= iVar6 - psVar2[lVar1 + 1])) {
LAB_001055a7:
                this->edgeImg[lVar10 + lVar4] = 0xfe;
                local_40.y = iVar7;
                std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
                emplace_back<cv::Point_<int>>(local_38,&local_40);
              }
            }
            else if ((this->anchorThresh <= iVar6 - psVar2[iVar8 * iVar5 + local_40.x]) &&
                    (this->anchorThresh <= iVar6 - psVar2[iVar5 * iVar9 + local_40.x]))
            goto LAB_001055a7;
          }
          lVar10 = lVar10 + iVar3;
          iVar5 = this->width;
        } while ((int)lVar10 < iVar5 + -2);
      }
      iVar7 = iVar7 + 1;
      iVar9 = iVar9 + 1;
      iVar8 = iVar8 + 1;
    } while (iVar7 < this->height + -2);
  }
  this->anchorNos =
       (int)((ulong)((long)(this->anchorPoints).
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->anchorPoints).
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  return;
}

Assistant:

void ED::ComputeAnchorPoints()
{
	//memset(edgeImg, 0, width*height);
	for (int i = 2; i<height - 2; i++) {
		int start = 2;
		int inc = 1;
		if (i%scanInterval != 0) { start = scanInterval; inc = scanInterval; }

		for (int j = start; j<width - 2; j += inc) {
			if (gradImg[i*width + j] < gradThresh) continue;

			if (dirImg[i*width + j] == EDGE_VERTICAL) {
				// vertical edge
				int diff1 = gradImg[i*width + j] - gradImg[i*width + j - 1];
				int diff2 = gradImg[i*width + j] - gradImg[i*width + j + 1];
				if (diff1 >= anchorThresh && diff2 >= anchorThresh) {
					edgeImg[i*width + j] = ANCHOR_PIXEL;
					anchorPoints.push_back(Point(j, i)); 
				}

			}
			else {
				// horizontal edge
				int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j];
				int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j];
				if (diff1 >= anchorThresh && diff2 >= anchorThresh) {
					edgeImg[i*width + j] = ANCHOR_PIXEL;
					anchorPoints.push_back(Point(j, i)); 
				}
			} // end-else
		} //end-for-inner
	} //end-for-outer

	anchorNos = (int)anchorPoints.size(); // get the total number of anchor points
}